

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnitTest.hh
# Opt level: O2

void __thiscall TestCase<true>::~TestCase(TestCase<true> *this)

{
  (this->super_BaseCase)._vptr_BaseCase = (_func_int **)&PTR_run_00113a98;
  std::__cxx11::string::~string((string *)&this->defined_file_);
  std::__cxx11::string::~string((string *)&this->case_name_);
  std::_Function_base::~_Function_base(&(this->method_).super__Function_base);
  return;
}

Assistant:

~TestCase() override = default;